

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O2

void __thiscall xmrig::FailoverStrategy::resume(FailoverStrategy *this)

{
  IStrategyListener *pIVar1;
  IClient *pIVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar3;
  undefined4 extraout_var;
  
  iVar3 = (*(this->super_IStrategy)._vptr_IStrategy[2])();
  if ((char)iVar3 != '\0') {
    pIVar1 = this->m_listener;
    pIVar2 = (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>
             ._M_impl.super__Vector_impl_data._M_start[this->m_active];
    iVar3 = (*pIVar2->_vptr_IClient[9])(pIVar2);
    UNRECOVERED_JUMPTABLE = pIVar1->_vptr_IStrategyListener[3];
    (*UNRECOVERED_JUMPTABLE)(pIVar1,this,pIVar2,CONCAT44(extraout_var,iVar3),UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void xmrig::FailoverStrategy::resume()
{
    if (!isActive()) {
        return;
    }

    m_listener->onJob(this, active(), active()->job());
}